

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O1

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint uVar13;
  size_t sVar14;
  size_t sVar15;
  undefined1 auVar16 [16];
  int *piVar17;
  Mat *pMVar18;
  int iVar19;
  void *pvVar20;
  ulong uVar21;
  long lVar22;
  undefined2 *puVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  void *pvVar28;
  undefined2 *puVar29;
  uint *puVar30;
  long lVar31;
  undefined4 uVar32;
  undefined2 *puVar33;
  long lVar34;
  undefined2 *puVar35;
  long lVar36;
  short tmp [6] [3];
  ulong local_118;
  void *local_e8;
  Mat local_d8;
  ulong local_88;
  Mat *local_80;
  void *local_78;
  long local_70;
  ulong local_68;
  undefined8 local_60;
  short sStack_58;
  uint auStack_56 [9];
  
  uVar27 = (ulong)(uint)outch;
  local_d8.cstep = 0;
  local_d8.data = (void *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize = 0;
  local_d8.elempack = 0;
  local_d8.allocator = (Allocator *)0x0;
  local_d8.dims = 0;
  local_d8.w = 0;
  local_d8.h = 0;
  local_d8.d = 0;
  local_d8.c = 0;
  local_80 = kernel_tm;
  Mat::create(&local_d8,0x24,inch,outch,2,(Allocator *)0x0);
  pMVar18 = local_80;
  if (0 < outch) {
    local_78 = kernel->data;
    local_e8 = local_d8.data;
    local_70 = local_d8.cstep * local_d8.elemsize;
    local_60 = (long)local_d8.w * local_d8.elemsize;
    local_68 = (ulong)(uint)inch;
    local_118 = 0;
    do {
      if (0 < inch) {
        iVar19 = inch * 9 * (int)local_118;
        uVar21 = 0;
        pvVar28 = local_e8;
        do {
          lVar36 = uVar21 * 9;
          cVar1 = *(char *)((long)local_78 + lVar36 + iVar19);
          cVar2 = *(char *)((long)local_78 + lVar36 + (long)iVar19 + 1);
          cVar3 = *(char *)((long)local_78 + lVar36 + (long)iVar19 + 2);
          cVar4 = *(char *)((long)local_78 + lVar36 + (long)iVar19 + 3);
          cVar5 = *(char *)((long)local_78 + lVar36 + (long)iVar19 + 4);
          cVar6 = *(char *)((long)local_78 + lVar36 + (long)iVar19 + 5);
          cVar7 = *(char *)((long)local_78 + lVar36 + (long)iVar19 + 6);
          cVar8 = *(char *)((long)local_78 + lVar36 + (long)iVar19 + 7);
          cVar9 = *(char *)((long)local_78 + lVar36 + (long)iVar19 + 8);
          lVar36 = 4;
          do {
            sVar10 = *(short *)(&UNK_005933ec + lVar36);
            sVar11 = *(short *)(&UNK_005933ee + lVar36);
            sVar12 = *(short *)((long)&DAT_005933f0 + lVar36);
            *(short *)((long)&local_60 + lVar36 + 4) =
                 sVar12 * cVar3 + sVar11 * cVar2 + sVar10 * cVar1;
            *(short *)((long)&local_60 + lVar36 + 6) =
                 sVar12 * cVar6 + sVar11 * cVar5 + sVar10 * cVar4;
            *(short *)((long)auStack_56 + lVar36 + -2) =
                 sVar12 * cVar9 + sVar11 * cVar8 + sVar10 * cVar7;
            lVar36 = lVar36 + 6;
          } while (lVar36 != 0x28);
          lVar36 = 0;
          pvVar20 = pvVar28;
          do {
            sVar10 = *(short *)((long)auStack_56 + lVar36 * 6 + -2);
            uVar13 = *(uint *)((long)auStack_56 + lVar36 * 6);
            puVar30 = &DAT_005933f2;
            lVar31 = 0;
            do {
              auVar16 = vpmullw_avx(ZEXT416(*puVar30),ZEXT416(uVar13));
              uVar32 = vpextrw_avx(auVar16,1);
              *(short *)((long)pvVar20 + lVar31 * 2) =
                   (short)uVar32 + auVar16._0_2_ + *(short *)((long)puVar30 + -2) * sVar10;
              lVar31 = lVar31 + 1;
              puVar30 = (uint *)((long)puVar30 + 6);
            } while (lVar31 != 6);
            lVar36 = lVar36 + 1;
            pvVar20 = (void *)((long)pvVar20 + 0xc);
          } while (lVar36 != 6);
          uVar21 = uVar21 + 1;
          pvVar28 = (void *)((long)pvVar28 + local_60);
        } while (uVar21 != local_68);
      }
      local_118 = local_118 + 1;
      local_e8 = (void *)((long)local_e8 + local_70);
    } while (local_118 != uVar27);
  }
  iVar19 = inch + 7;
  if (-1 < inch) {
    iVar19 = inch;
  }
  iVar24 = outch + 3;
  if (-1 < outch) {
    iVar24 = outch;
  }
  local_88 = uVar27;
  Mat::create(local_80,iVar19 >> 3,0x24,iVar24 >> 2,0x40,0x20,(Allocator *)0x0);
  if (3 < outch) {
    iVar19 = pMVar18->w;
    pvVar28 = pMVar18->data;
    sVar14 = pMVar18->elemsize;
    sVar15 = pMVar18->cstep;
    uVar21 = 0;
    do {
      puVar33 = (undefined2 *)(local_d8.cstep * local_d8.elemsize * uVar21 + (long)local_d8.data);
      lVar36 = 0;
      do {
        if (7 < inch) {
          lVar31 = (long)pvVar28 + (long)iVar19 * sVar14 * lVar36 + (uVar21 >> 2) * sVar15 * sVar14;
          puVar29 = puVar33;
          lVar34 = 0;
          do {
            lVar25 = 0;
            puVar35 = puVar29;
            do {
              lVar22 = lVar31;
              lVar31 = 0;
              puVar23 = puVar35;
              do {
                *(undefined2 *)(lVar22 + lVar31) = *puVar23;
                puVar23 = (undefined2 *)((long)puVar23 + (long)local_d8.w * local_d8.elemsize);
                lVar31 = lVar31 + 2;
              } while (lVar31 != 0x10);
              lVar25 = lVar25 + 1;
              puVar35 = (undefined2 *)((long)puVar35 + local_d8.cstep * local_d8.elemsize);
              lVar31 = lVar22 + 0x10;
            } while (lVar25 != 4);
            lVar25 = lVar34 + 0xf;
            puVar29 = puVar29 + (long)local_d8.w * local_d8.elemsize * 4;
            lVar31 = lVar22 + 0x10;
            lVar34 = lVar34 + 8;
          } while (lVar25 < inch);
        }
        lVar36 = lVar36 + 1;
        puVar33 = puVar33 + 1;
      } while (lVar36 != 0x24);
      uVar26 = uVar21 + 7;
      uVar21 = uVar21 + 4;
    } while (uVar26 < uVar27);
  }
  piVar17 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if (local_d8.allocator == (Allocator *)0x0) {
        if (local_d8.data != (void *)0x0) {
          free(local_d8.data);
        }
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse(kernel, kernel_tm, inch, outch, opt);
}